

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void charFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  byte bVar1;
  byte *pbVar2;
  int in_ESI;
  uint c;
  sqlite3_int64 x;
  int i;
  uchar *zOut;
  uchar *z;
  _func_void_void_ptr *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  uint in_stack_ffffffffffffffc4;
  char *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  int iVar3;
  byte *local_28;
  
  local_28 = (byte *)sqlite3_malloc64((sqlite3_uint64)in_stack_ffffffffffffffb8);
  if (local_28 == (byte *)0x0) {
    sqlite3_result_error_nomem((sqlite3_context *)0x1dbc00);
  }
  else {
    for (iVar3 = 0; iVar3 < in_ESI; iVar3 = iVar3 + 1) {
      in_stack_ffffffffffffffc8 = (char *)sqlite3_value_int64((sqlite3_value *)0x1dbc2e);
      if (((long)in_stack_ffffffffffffffc8 < 0) || (0x10ffff < (long)in_stack_ffffffffffffffc8)) {
        in_stack_ffffffffffffffc8 = (char *)0xfffd;
      }
      in_stack_ffffffffffffffc4 = (uint)in_stack_ffffffffffffffc8 & 0x1fffff;
      bVar1 = (byte)in_stack_ffffffffffffffc4;
      if (in_stack_ffffffffffffffc4 < 0x80) {
        *local_28 = bVar1;
        local_28 = local_28 + 1;
      }
      else if (in_stack_ffffffffffffffc4 < 0x800) {
        pbVar2 = local_28 + 1;
        *local_28 = ((byte)(in_stack_ffffffffffffffc4 >> 6) & 0x1f) - 0x40;
        local_28 = local_28 + 2;
        *pbVar2 = (bVar1 & 0x3f) + 0x80;
      }
      else if (in_stack_ffffffffffffffc4 < 0x10000) {
        *local_28 = ((byte)(in_stack_ffffffffffffffc4 >> 0xc) & 0xf) - 0x20;
        pbVar2 = local_28 + 2;
        local_28[1] = ((byte)(in_stack_ffffffffffffffc4 >> 6) & 0x3f) + 0x80;
        local_28 = local_28 + 3;
        *pbVar2 = (bVar1 & 0x3f) + 0x80;
      }
      else {
        *local_28 = (char)(in_stack_ffffffffffffffc4 >> 0x12) - 0x10;
        local_28[1] = ((byte)(in_stack_ffffffffffffffc4 >> 0xc) & 0x3f) + 0x80;
        pbVar2 = local_28 + 3;
        local_28[2] = ((byte)(in_stack_ffffffffffffffc4 >> 6) & 0x3f) + 0x80;
        local_28 = local_28 + 4;
        *pbVar2 = (bVar1 & 0x3f) + 0x80;
      }
    }
    sqlite3_result_text64
              ((sqlite3_context *)CONCAT44(iVar3,in_stack_ffffffffffffffd0),
               in_stack_ffffffffffffffc8,
               CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
               in_stack_ffffffffffffffb8,'\0');
  }
  return;
}

Assistant:

static void charFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  unsigned char *z, *zOut;
  int i;
  zOut = z = sqlite3_malloc64( argc*4+1 );
  if( z==0 ){
    sqlite3_result_error_nomem(context);
    return;
  }
  for(i=0; i<argc; i++){
    sqlite3_int64 x;
    unsigned c;
    x = sqlite3_value_int64(argv[i]);
    if( x<0 || x>0x10ffff ) x = 0xfffd;
    c = (unsigned)(x & 0x1fffff);
    if( c<0x00080 ){
      *zOut++ = (u8)(c&0xFF);
    }else if( c<0x00800 ){
      *zOut++ = 0xC0 + (u8)((c>>6)&0x1F);
      *zOut++ = 0x80 + (u8)(c & 0x3F);
    }else if( c<0x10000 ){
      *zOut++ = 0xE0 + (u8)((c>>12)&0x0F);
      *zOut++ = 0x80 + (u8)((c>>6) & 0x3F);
      *zOut++ = 0x80 + (u8)(c & 0x3F);
    }else{
      *zOut++ = 0xF0 + (u8)((c>>18) & 0x07);
      *zOut++ = 0x80 + (u8)((c>>12) & 0x3F);
      *zOut++ = 0x80 + (u8)((c>>6) & 0x3F);
      *zOut++ = 0x80 + (u8)(c & 0x3F);
    }                                                    \
  }
  sqlite3_result_text64(context, (char*)z, zOut-z, sqlite3_free, SQLITE_UTF8);
}